

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subquery_relation.cpp
# Opt level: O0

void __thiscall
duckdb::SubqueryRelation::SubqueryRelation
          (SubqueryRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,string *alias_p)

{
  Relation *in_RSI;
  undefined8 *in_RDI;
  vector<duckdb::ColumnDefinition,_true> dummy_columns;
  shared_ptr<duckdb::Relation,_true> *in_stack_ffffffffffffff98;
  vector<duckdb::ColumnDefinition,_true> *columns;
  string *in_stack_ffffffffffffffb8;
  RelationType in_stack_ffffffffffffffc7;
  pointer in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  
  shared_ptr<duckdb::Relation,_true>::operator->((shared_ptr<duckdb::Relation,_true> *)in_RSI);
  Relation::Relation((Relation *)in_stack_ffffffffffffffd0,
                     (shared_ptr<duckdb::ClientContextWrapper,_true> *)in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc7,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__SubqueryRelation_03533238;
  shared_ptr<duckdb::Relation,_true>::shared_ptr
            ((shared_ptr<duckdb::Relation,_true> *)in_RSI,in_stack_ffffffffffffff98);
  columns = (vector<duckdb::ColumnDefinition,_true> *)&stack0xffffffffffffffc0;
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195e105);
  Relation::TryBindRelation(in_RSI,columns);
  vector<duckdb::ColumnDefinition,_true>::~vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195e11f);
  return;
}

Assistant:

SubqueryRelation::SubqueryRelation(shared_ptr<Relation> child_p, const string &alias_p)
    : Relation(child_p->context, RelationType::SUBQUERY_RELATION, alias_p), child(std::move(child_p)) {
	D_ASSERT(child.get() != this);
	vector<ColumnDefinition> dummy_columns;
	Relation::TryBindRelation(dummy_columns);
}